

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O2

SRes SzAr_DecodeFolder(CSzAr *p,UInt32 folderIndex,ILookInStream *inStream,UInt64 startPos,
                      Byte *outBuffer,size_t outSize,ISzAlloc *allocMain)

{
  CSzCoderInfo *pCVar1;
  _func_void_void_ptr_void_ptr **pp_Var2;
  ushort uVar3;
  Byte aBVar4 [4];
  size_t sVar5;
  UInt64 *pUVar6;
  long lVar7;
  SizeT SVar8;
  undefined8 uVar9;
  char cVar22;
  int __result__;
  uint uVar10;
  Byte aBVar11 [4];
  uint uVar12;
  uint uVar13;
  Bool BVar14;
  uint uVar15;
  int iVar16;
  UInt32 UVar17;
  ISzAlloc *pIVar18;
  _func_void_void_ptr_void_ptr *p_Var19;
  UInt64 UVar20;
  code *pcVar21;
  byte bVar23;
  ISzAlloc *alloc;
  uint *puVar24;
  byte bVar25;
  Byte BVar26;
  _func_void_ptr_void_ptr_size_t *p_Var27;
  _func_void_void_ptr_void_ptr *p_Var28;
  Byte *pBVar29;
  Byte aBVar30 [4];
  int iVar31;
  _func_void_ptr_void_ptr_size_t *p_Var32;
  byte *pbVar33;
  ulong uVar34;
  _func_void_ptr_void_ptr_size_t *p_Var35;
  _func_void_ptr_void_ptr_size_t *p_Var36;
  long lVar37;
  _func_void_ptr_void_ptr_size_t *p_Var38;
  uint uVar39;
  _func_void_ptr_void_ptr_size_t *p_Var40;
  ulong uVar41;
  byte *pbVar42;
  _func_void_ptr_void_ptr_size_t *p_Var43;
  UInt32 *value;
  UInt64 inSize;
  ulong uVar44;
  bool bVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  ELzmaStatus local_524;
  _func_void_ptr_void_ptr_size_t *local_520;
  byte *local_518;
  _func_void_ptr_void_ptr_size_t *local_510;
  ulong local_508;
  ILookInStream *local_500;
  CSzData local_4f8;
  uint local_4e4;
  SizeT inProcessed;
  void *inBuf;
  code *local_4d0;
  CSzAr *local_4c8;
  byte *local_4c0;
  Byte coderUsed [4];
  long lStack_4b0;
  _func_void_ptr_void_ptr_size_t *local_498;
  _func_void_void_ptr_void_ptr *local_480;
  UInt32 numStreams;
  undefined8 local_460;
  undefined1 local_458 [16];
  _func_void_void_ptr_void_ptr *local_448;
  Byte *local_440;
  _func_void_ptr_void_ptr_size_t *local_438;
  _func_void_ptr_void_ptr_size_t *local_430;
  undefined8 local_428;
  byte *local_420;
  uint local_418;
  UInt32 local_414;
  byte local_410 [3];
  undefined1 local_40d;
  uint uStack_40c;
  uint uStack_408;
  int local_404 [2];
  uint local_3fc [7];
  uint local_3e0;
  uint local_3dc;
  uint local_3d8;
  byte local_3d4;
  int local_3d0;
  int iStack_3cc;
  int local_3c8;
  Byte *tempBuf [3];
  Byte local_1c8 [4];
  int iStack_1c4;
  int iStack_1c0;
  int iStack_1bc;
  int local_1b8 [5];
  int local_1a4;
  CSzCoderInfo local_1a0;
  CSzCoderInfo local_190;
  CSzCoderInfo local_180;
  int local_168;
  char local_164;
  byte *local_160;
  byte *local_158;
  code *local_150;
  UInt64 *local_148;
  _func_void_ptr_void_ptr_size_t *local_140;
  UInt32 numCoders;
  undefined1 uStack_134;
  undefined3 uStack_133;
  
  sVar5 = p->FoCodersOffsets[folderIndex];
  pBVar29 = p->CodersData;
  local_4f8.Size = p->FoCodersOffsets[(ulong)folderIndex + 1] - sVar5;
  local_510 = (_func_void_ptr_void_ptr_size_t *)outSize;
  local_4f8.Data = pBVar29 + sVar5;
  uVar10 = SzReadNumber32(&local_4f8,&numCoders);
  if (uVar10 != 0) {
    return uVar10;
  }
  pbVar33 = (byte *)((ulong)_numCoders & 0xffffffff);
  if (numCoders - 5 < 0xfffffffc) {
    return 4;
  }
  aBVar30[0] = '\0';
  aBVar30[1] = '\0';
  aBVar30[2] = '\0';
  aBVar30[3] = '\0';
  local_518 = pbVar33;
  local_500 = inStream;
  local_4c8 = p;
  local_4c0 = pBVar29 + sVar5;
  for (pbVar42 = (byte *)0x0; pbVar42 != pbVar33; pbVar42 = pbVar42 + 1) {
    if (local_4f8.Size == 0) {
      return 0x10;
    }
    bVar25 = *local_4f8.Data;
    if (0x3f < bVar25) {
      return 4;
    }
    uVar10 = bVar25 & 0xf;
    if (8 < uVar10) {
      return 4;
    }
    if (local_4f8.Size - 1 < (ulong)uVar10) {
      return 0x10;
    }
    uVar34 = 0;
    for (lVar37 = 0; uVar10 != (uint)lVar37; lVar37 = lVar37 + 1) {
      uVar34 = uVar34 << 8 | (ulong)local_4f8.Data[lVar37 + 1];
    }
    local_4f8.Data = local_4f8.Data + lVar37 + 1;
    local_4f8.Size = (local_4f8.Size - 1) - lVar37;
    if (uVar34 >> 0x20 != 0) {
      return 4;
    }
    (&local_1a0)[(long)pbVar42].MethodID = (UInt32)uVar34;
    (&local_1a0)[(long)pbVar42].NumStreams = '\x01';
    (&local_1a0)[(long)pbVar42].PropsSize = '\0';
    (&local_1a0)[(long)pbVar42].PropsOffset = 0;
    UVar17 = 1;
    if ((bVar25 & 0x10) != 0) {
      uVar10 = SzReadNumber32(&local_4f8,&numStreams);
      if (uVar10 != 0) {
        return uVar10;
      }
      UVar17 = numStreams;
      if (7 < numStreams) {
        return 4;
      }
      (&local_1a0)[(long)pbVar42].NumStreams = (Byte)_numStreams;
      uVar10 = SzReadNumber32(&local_4f8,&numStreams);
      if (uVar10 != 0) {
        return uVar10;
      }
      pbVar33 = local_518;
      if (numStreams != 1) {
        return 4;
      }
    }
    aBVar30 = (Byte  [4])((int)aBVar30 + UVar17);
    if (7 < (uint)aBVar30) {
      return 4;
    }
    if (0x1f < bVar25) {
      _numStreams = (_func_void_void_ptr_void_ptr *)((ulong)_numStreams & 0xffffffff00000000);
      uVar10 = SzReadNumber32(&local_4f8,&numStreams);
      if (uVar10 != 0) {
        return uVar10;
      }
      uVar34 = (ulong)_numStreams & 0xffffffff;
      bVar45 = local_4f8.Size < uVar34;
      local_4f8.Size = local_4f8.Size - uVar34;
      if (bVar45) {
        return 0x10;
      }
      if (0x7f < numStreams) {
        return 4;
      }
      (&local_1a0)[(long)pbVar42].PropsOffset = (long)local_4f8.Data - (long)local_4c0;
      (&local_1a0)[(long)pbVar42].PropsSize = (Byte)_numStreams;
      local_4f8.Data = local_4f8.Data + uVar34;
      pbVar33 = local_518;
    }
  }
  aBVar11 = (Byte  [4])((int)pbVar33 - 1);
  uVar10 = (int)aBVar30 - (int)aBVar11;
  if ((uint)aBVar11 <= (uint)aBVar30) {
    if (3 < (uint)aBVar11) {
      return 4;
    }
    if (4 < uVar10) {
      return 4;
    }
    for (uVar34 = 0; (uint)aBVar30 != uVar34; uVar34 = uVar34 + 1) {
      *(undefined1 *)((long)&numStreams + uVar34) = 0;
    }
    if (aBVar11 == (Byte  [4])0x0) {
      pbVar42 = (byte *)0x0;
      uVar12 = uVar10;
    }
    else {
      for (pbVar42 = (byte *)0x0; pbVar33 != pbVar42; pbVar42 = pbVar42 + 1) {
        coderUsed[(long)pbVar42] = '\0';
      }
      local_520 = (_func_void_ptr_void_ptr_size_t *)CONCAT44(local_520._4_4_,uVar10);
      uVar34 = (ulong)(uint)aBVar11;
      value = (UInt32 *)(local_1b8 + 1);
      while (bVar45 = uVar34 != 0, uVar34 = uVar34 - 1, bVar45) {
        uVar12 = SzReadNumber32(&local_4f8,value + -1);
        if (uVar12 != 0) {
          return uVar12;
        }
        aBVar4 = *(Byte (*) [4])(value + -1);
        if ((uint)aBVar30 <= (uint)aBVar4) {
          return 0x10;
        }
        if (*(char *)((long)&numStreams + (ulong)(uint)aBVar4) != '\0') {
          return 0x10;
        }
        *(undefined1 *)((long)&numStreams + (ulong)(uint)aBVar4) = 1;
        uVar12 = SzReadNumber32(&local_4f8,value);
        if (uVar12 != 0) {
          return uVar12;
        }
        uVar12 = *value;
        if ((uint)local_518 <= uVar12) {
          return 0x10;
        }
        BVar26 = coderUsed[uVar12];
        value = value + 2;
        coderUsed[uVar12] = BVar26 + (BVar26 == '\0');
        pbVar33 = local_518;
        if (BVar26 != '\0') {
          return 0x10;
        }
      }
      pbVar42 = (byte *)0x0;
      while( true ) {
        if (pbVar33 == pbVar42) {
          return 0x10;
        }
        if (coderUsed[(long)pbVar42] == '\0') break;
        pbVar42 = pbVar42 + 1;
      }
      if ((int)pbVar33 == (int)pbVar42) {
        return 0x10;
      }
      uVar12 = (uint)local_520;
    }
    uVar13 = (uint)pbVar33;
    if (uVar12 != 1) {
      for (uVar34 = 0; uVar13 = (uint)pbVar33, uVar12 != uVar34; uVar34 = uVar34 + 1) {
        uVar13 = SzReadNumber32(&local_4f8,(UInt32 *)coderUsed);
        if (uVar13 != 0) {
          return uVar13;
        }
        if ((uint)aBVar30 <= (uint)coderUsed) {
          return 0x10;
        }
        if (*(char *)((long)&numStreams + (ulong)(uint)coderUsed) != '\0') {
          return 0x10;
        }
        *(undefined1 *)((long)&numStreams + (ulong)(uint)coderUsed) = 1;
        *(Byte (*) [4])(local_1c8 + uVar34 * 4) = coderUsed;
        pbVar33 = local_518;
      }
LAB_0010f683:
      if (local_4f8.Size != 0) {
        return 0xb;
      }
      if ((uint)pbVar42 != (uint)local_4c8->FoToMainUnpackSizeIndex[folderIndex]) {
        return 0xb;
      }
      pUVar6 = local_4c8->CoderUnpackSizes;
      uVar12 = local_4c8->FoToCoderUnpackSizes[folderIndex];
      if ((_func_void_ptr_void_ptr_size_t *)pUVar6[(uint)pbVar42 + uVar12] != local_510) {
        return 0xb;
      }
      tempBuf[0] = (Byte *)0x0;
      tempBuf[1] = (Byte *)0x0;
      tempBuf[2] = (Byte *)0x0;
      pIVar18 = (ISzAlloc *)
                (local_4c8->PackPositions + local_4c8->FoStartPackStreamIndex[folderIndex]);
      _coderUsed = (undefined1  [16])0x0;
      BVar14 = IS_SUPPORTED_CODER(&local_1a0);
      uVar15 = 4;
      uVar39 = local_4e4;
      if (BVar14 != 0) {
        if ((int)local_518 == 4) {
          BVar14 = IS_SUPPORTED_CODER(&local_190);
          uVar39 = local_4e4;
          if ((BVar14 != 0) &&
             (BVar14 = IS_SUPPORTED_CODER(&local_180), uVar39 = local_4e4, BVar14 != 0)) {
            auVar47._0_4_ = -(uint)(aBVar11 == (Byte  [4])0x3);
            auVar47._4_4_ = -(uint)(local_1b8[0] == 5);
            auVar47._8_4_ = -(uint)(local_1b8[1] == 0);
            auVar47._12_4_ = -(uint)(local_1b8[2] == 4);
            auVar46._0_4_ = -(uint)(local_1c8 == (Byte  [4])0x2);
            auVar46._4_4_ = -(uint)(iStack_1c4 == 6);
            auVar46._8_4_ = -(uint)(iStack_1c0 == 1);
            auVar46._12_4_ = -(uint)(iStack_1bc == 0);
            auVar46 = packssdw(auVar46,auVar47);
            auVar46 = packsswb(auVar46,auVar46);
            if (((byte)(SUB161(auVar46 >> 7,0) & 1 | (SUB161(auVar46 >> 0xf,0) & 1) << 1 |
                        (SUB161(auVar46 >> 0x17,0) & 1) << 2 | (SUB161(auVar46 >> 0x1f,0) & 1) << 3
                        | (SUB161(auVar46 >> 0x27,0) & 1) << 4 |
                        (SUB161(auVar46 >> 0x2f,0) & 1) << 5 | (SUB161(auVar46 >> 0x37,0) & 1) << 6
                       | SUB161(auVar46 >> 0x3f,0) << 7) == 0xff) &&
               (((((local_168 == 0x303011b && (uVar10 == 4)) && (local_1b8[3] == 1)) &&
                 ((local_1b8[4] == 3 && (local_1a4 == 2)))) && (local_164 == '\x04'))))
            goto LAB_0010f93e;
          }
        }
        else if ((int)local_518 == 2) {
          if ((((local_190.NumStreams == '\x01') && (uVar10 == 1)) &&
              ((local_1c8 == (Byte  [4])0x0 &&
               (((aBVar11 == (Byte  [4])0x1 && (local_1b8[0] == 1)) && (local_1b8[1] == 0)))))) &&
             (((local_190.MethodID == 3 || (local_190.MethodID == 0x3030103)) ||
              ((local_190.MethodID == 0x3030205 ||
               (((local_190.MethodID == 0x3030401 || (local_190.MethodID == 0x3030501)) ||
                ((local_190.MethodID == 0x3030701 || (local_190.MethodID == 0x3030805))))))))))
          goto LAB_0010f93e;
        }
        else if (((((int)local_518 == 1) && (uVar10 == 1)) && (local_1c8 == (Byte  [4])0x0)) &&
                (aBVar11 == (Byte  [4])0x0)) {
LAB_0010f93e:
          local_148 = pUVar6 + uVar12;
          local_160 = outBuffer + (long)local_510;
          local_4d0 = local_510 + -4;
          local_150 = local_510 + -0x10;
          local_158 = outBuffer + -4 + (long)local_510;
          local_4e4 = 1;
          local_508 = 0;
          local_480 = (_func_void_void_ptr_void_ptr *)0x0;
          local_498 = (_func_void_ptr_void_ptr_size_t *)0x0;
LAB_0010f9aa:
          uVar34 = local_508;
          uVar39 = local_4e4;
          if (local_508 < ((ulong)local_518 & 0xffffffff)) {
            pCVar1 = &local_1a0 + local_508;
            UVar17 = (&local_1a0)[local_508].MethodID;
            if ((UVar17 != 0) && (UVar17 != 0x21)) {
              if (UVar17 != 0x303011b) {
                if (UVar17 == 0x30101) goto LAB_0010f9f3;
                if (local_508 != 1) goto LAB_00111028;
                if (UVar17 == 3) {
                  if (local_190.PropsSize != '\x01') goto LAB_00111028;
                  for (lVar37 = 0; lVar37 != 0x100; lVar37 = lVar37 + 1) {
                    *(undefined1 *)((long)&numCoders + lVar37) = 0;
                  }
                  uVar44 = (ulong)local_4c0[pCVar1->PropsOffset] + 1;
                  uVar10 = (uint)uVar44;
                  MyMemCpy((Byte *)&numStreams,(Byte *)&numCoders,uVar10);
                  uVar34 = 0;
                  p_Var38 = (_func_void_ptr_void_ptr_size_t *)0x0;
                  while (p_Var40 = p_Var38, p_Var40 < local_510) {
                    for (uVar34 = 0;
                        (p_Var38 = p_Var40 + uVar34, uVar34 < uVar44 && (p_Var38 < local_510));
                        uVar34 = uVar34 + 1) {
                      BVar26 = (outBuffer + (long)p_Var40)[uVar34] +
                               *(char *)((long)&numStreams + uVar34);
                      (outBuffer + (long)p_Var40)[uVar34] = BVar26;
                      *(Byte *)((long)&numStreams + uVar34) = BVar26;
                    }
                  }
                  uVar41 = uVar34 & 0xffffffff;
                  if ((uint)uVar34 == uVar10) {
                    uVar41 = 0;
                  }
                  MyMemCpy((Byte *)&numCoders,(Byte *)((long)&numStreams + uVar41),
                           uVar10 - (uint)uVar41);
                  MyMemCpy((Byte *)((long)&numCoders + (uVar44 - uVar41)),(Byte *)&numStreams,
                           (uint)uVar41);
                }
                else {
                  if (local_190.PropsSize != '\0') goto LAB_00111028;
                  if (UVar17 == 0x3030805) {
                    if ((_func_void_ptr_void_ptr_size_t *)0x3 < local_510) {
                      iVar16 = 0;
                      iVar31 = 0;
                      uVar10 = 0;
                      for (uVar34 = 1; pcVar21 = (code *)(ulong)((int)uVar34 - 1),
                          pcVar21 <= local_4d0; uVar34 = uVar34 + 4) {
                        if (outBuffer[(long)pcVar21] == '\x7f') {
                          bVar25 = outBuffer[uVar34];
                          if (0xbf < bVar25) {
                            uVar44 = (ulong)(uVar10 | 1);
                            goto LAB_00110c58;
                          }
                        }
                        else if ((outBuffer[(long)pcVar21] == '@') &&
                                (bVar25 = outBuffer[uVar34], uVar44 = uVar34, bVar25 < 0x40)) {
LAB_00110c58:
                          uVar15 = (uint)outBuffer[uVar34 + 2] |
                                   (uint)outBuffer[uVar34 + 1] << 8 | (uint)bVar25 << 0x10;
                          uVar12 = iVar31 + uVar15 * 4;
                          uVar39 = uVar12 >> 2;
                          uVar15 = (int)(uVar15 * 0x200 + iVar16) >> 9 & 0x3fc00000;
                          outBuffer[(long)pcVar21] = (byte)(uVar15 >> 0x18) | 0x40;
                          outBuffer[uVar44] = (byte)(uVar39 >> 0x10) & 0x3f | (byte)(uVar15 >> 0x10)
                          ;
                          outBuffer[uVar34 + 1] = (Byte)(uVar12 >> 10);
                          outBuffer[uVar34 + 2] = (Byte)uVar39;
                        }
                        uVar10 = uVar10 + 4;
                        iVar31 = iVar31 + -4;
                        iVar16 = iVar16 + -0x200;
                      }
                    }
                  }
                  else if (UVar17 == 0x3030205) {
                    if ((_func_void_ptr_void_ptr_size_t *)0x3 < local_510) {
                      iVar16 = 0;
                      for (pcVar21 = (code *)0x0; pcVar21 <= local_4d0; pcVar21 = pcVar21 + 4) {
                        if ((outBuffer[(long)pcVar21] & 0xfc) == 0x48) {
                          bVar25 = (outBuffer + 3)[(long)pcVar21];
                          if ((bVar25 & 3) == 1) {
                            iVar31 = (bVar25 & 0xfffffffc |
                                     (uint)(outBuffer + 2)[(long)pcVar21] << 8 |
                                     (uint)(outBuffer + 1)[(long)pcVar21] << 0x10 |
                                     (outBuffer[(long)pcVar21] & 3) << 0x18) + iVar16;
                            outBuffer[(long)pcVar21] = (byte)((uint)iVar31 >> 0x18) & 3 | 0x48;
                            (outBuffer + 1)[(long)pcVar21] = (Byte)((uint)iVar31 >> 0x10);
                            (outBuffer + 2)[(long)pcVar21] = (Byte)((uint)iVar31 >> 8);
                            (outBuffer + 3)[(long)pcVar21] = bVar25 + (char)iVar16;
                          }
                        }
                        iVar16 = iVar16 + -4;
                      }
                    }
                  }
                  else if (UVar17 == 0x3030401) {
                    if ((_func_void_ptr_void_ptr_size_t *)0xf < local_510) {
                      pBVar29 = outBuffer;
                      for (pcVar21 = (code *)0x0; pcVar21 <= local_150; pcVar21 = pcVar21 + 0x10) {
                        bVar25 = ""[outBuffer[(long)pcVar21] & 0x1f];
                        uVar34 = 5;
                        for (uVar10 = 0; uVar10 != 3; uVar10 = uVar10 + 1) {
                          if ((bVar25 >> (uVar10 & 0x1f) & 1) != 0) {
                            pbVar42 = pBVar29 + (uVar34 >> 3);
                            uVar44 = 0;
                            pbVar33 = pbVar42;
                            for (lVar37 = 0; lVar37 != 0x30; lVar37 = lVar37 + 8) {
                              uVar44 = uVar44 + ((ulong)*pbVar33 << ((byte)lVar37 & 0x3f));
                              pbVar33 = pbVar33 + 1;
                            }
                            bVar23 = (byte)uVar34 & 7;
                            uVar41 = uVar44 >> bVar23;
                            if ((uVar41 & 0x1e000000e00) == 0xa000000000) {
                              uVar12 = ((uint)(uVar41 >> 0x10) & 0x100000 |
                                       (uint)(uVar41 >> 0xd) & 0xfffff) * 0x10 - (int)pcVar21 >> 4;
                              for (lVar37 = 0; lVar37 != 0x30; lVar37 = lVar37 + 8) {
                                *pbVar42 = (byte)((((ulong)(uVar12 & 0x100000) << 0x10 |
                                                   (ulong)(uVar12 & 0xfffff) << 0xd |
                                                   uVar41 & 0xfffffeae000011ff) << bVar23 |
                                                  (ulong)((uint)uVar44 & ~(-1 << bVar23))) >>
                                                 ((byte)lVar37 & 0x3f));
                                pbVar42 = pbVar42 + 1;
                              }
                            }
                          }
                          uVar34 = uVar34 + 0x29;
                        }
                        pBVar29 = pBVar29 + 0x10;
                      }
                    }
                  }
                  else if (UVar17 == 0x3030501) {
                    if ((_func_void_ptr_void_ptr_size_t *)0x3 < local_510) {
                      iVar16 = -8;
                      for (pcVar21 = (code *)0x0; pcVar21 <= local_4d0; pcVar21 = pcVar21 + 4) {
                        if ((outBuffer + 3)[(long)pcVar21] == 0xeb) {
                          uVar10 = iVar16 + ((uint)outBuffer[(long)pcVar21] |
                                            (uint)(outBuffer + 1)[(long)pcVar21] << 8 |
                                            (uint)(outBuffer + 2)[(long)pcVar21] << 0x10) * 4;
                          (outBuffer + 2)[(long)pcVar21] = (Byte)(uVar10 >> 0x12);
                          (outBuffer + 1)[(long)pcVar21] = (Byte)(uVar10 >> 10);
                          outBuffer[(long)pcVar21] = (Byte)(uVar10 >> 2);
                        }
                        iVar16 = iVar16 + -4;
                      }
                    }
                  }
                  else if (UVar17 == 0x3030701) {
                    if ((_func_void_ptr_void_ptr_size_t *)0x3 < local_510) {
                      for (pcVar21 = (code *)0x0; pcVar21 <= local_4d0; pcVar21 = pcVar21 + 2) {
                        if ((((outBuffer + 1)[(long)pcVar21] & 0xf8) == 0xf0) &&
                           ((~(uint)(outBuffer + 3)[(long)pcVar21] & 0xf8) == 0)) {
                          uVar10 = (((uint)(outBuffer + 2)[(long)pcVar21] |
                                    ((outBuffer + 3)[(long)pcVar21] & 7) << 8 |
                                    (uint)outBuffer[(long)pcVar21] << 0xb |
                                    ((outBuffer + 1)[(long)pcVar21] & 7) << 0x13) * 2 - (int)pcVar21
                                   ) - 4;
                          (outBuffer + 1)[(long)pcVar21] = (byte)(uVar10 >> 0x14) & 7 | 0xf0;
                          outBuffer[(long)pcVar21] = (Byte)(uVar10 >> 0xc);
                          (outBuffer + 3)[(long)pcVar21] = (byte)(uVar10 >> 9) | 0xf8;
                          (outBuffer + 2)[(long)pcVar21] = (Byte)(uVar10 >> 1);
                          pcVar21 = pcVar21 + 2;
                        }
                      }
                    }
                  }
                  else {
                    if (UVar17 != 0x3030103) goto LAB_00111028;
                    if ((_func_void_ptr_void_ptr_size_t *)0x4 < local_510) {
                      uVar10 = 0;
                      lVar37 = 0;
                      do {
                        while( true ) {
                          uVar34 = 0;
                          while( true ) {
                            if (local_158 <= outBuffer + uVar34 + lVar37) goto LAB_00110a5c;
                            if ((outBuffer[uVar34 + lVar37] & 0xfe) == 0xe8) break;
                            uVar34 = uVar34 + 1;
                          }
                          uVar12 = 0;
                          if ((uVar34 < 3) &&
                             (bVar25 = (byte)uVar34 & 0x1f, uVar15 = uVar10 >> bVar25,
                             uVar10 >> bVar25 != 0)) break;
LAB_00110629:
                          if ((outBuffer[uVar34 + lVar37 + 4] + 1 & 0xfe) == 0) {
                            uVar15 = ((-5 - (int)lVar37) +
                                     ((uint)outBuffer[uVar34 + lVar37 + 1] |
                                     (uint)outBuffer[uVar34 + lVar37 + 2] << 8 |
                                     (uint)outBuffer[uVar34 + lVar37 + 3] << 0x10 |
                                     (uint)outBuffer[uVar34 + lVar37 + 4] << 0x18)) - (int)uVar34;
                            uVar10 = uVar15;
                            if ((uVar12 != 0) &&
                               (bVar25 = (byte)(uVar12 << 2) & 0x18,
                               uVar10 = ((((0x100 << bVar25) - 1U ^ uVar15) - (int)lVar37) -
                                        (int)uVar34) - 5, ((uVar15 >> bVar25) + 1 & 0xfe) != 0)) {
                              uVar10 = uVar15;
                            }
                            outBuffer[uVar34 + lVar37 + 1] = (Byte)uVar10;
                            outBuffer[uVar34 + lVar37 + 2] = (Byte)(uVar10 >> 8);
                            outBuffer[uVar34 + lVar37 + 3] = (Byte)(uVar10 >> 0x10);
                            outBuffer[uVar34 + lVar37 + 4] = (Byte)((int)(uVar10 << 7) >> 0x1f);
                            uVar10 = 0;
                            lVar37 = lVar37 + uVar34 + 5;
                          }
                          else {
                            uVar10 = uVar12 >> 1 | 4;
                            lVar37 = lVar37 + uVar34 + 1;
                          }
                        }
                        if ((uVar15 != 3 && uVar15 < 5) &&
                           (uVar12 = uVar15,
                           1 < (byte)(outBuffer[uVar34 + 1 + (ulong)(uVar15 >> 1) + lVar37] + 1)))
                        goto LAB_00110629;
                        uVar10 = uVar15 >> 1 | 4;
                        lVar37 = lVar37 + uVar34 + 1;
                      } while( true );
                    }
                  }
                }
                goto LAB_00110a5c;
              }
              if (local_508 != 3) goto LAB_00111028;
              p_Var19 = pIVar18->Free;
              p_Var28 = (_func_void_void_ptr_void_ptr *)pIVar18[1].Alloc;
              inSize = (long)p_Var28 - (long)p_Var19;
              pbVar33 = (byte *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,inSize);
              tempBuf[2] = pbVar33;
              if (pbVar33 == (byte *)0x0 && p_Var28 != p_Var19) {
LAB_0011102f:
                uVar15 = 2;
                uVar39 = local_4e4;
              }
              else {
                _numStreams = p_Var19 + startPos;
                uVar15 = (*local_500->Seek)(local_500,(Int64 *)&numStreams,SZ_SEEK_SET);
                uVar39 = local_4e4;
                if ((uVar15 == 0) &&
                   (uVar15 = SzDecodeCopy(inSize,local_500,pbVar33), uVar39 = local_4e4, uVar15 == 0
                   )) {
                  if (((_coderUsed & (undefined1  [16])0x3) != (undefined1  [16])0x0) ||
                     (((_coderUsed & (undefined1  [16])0x3) != (undefined1  [16])0x0 ||
                      (local_498 + lStack_4b0 + _coderUsed != local_510)))) goto LAB_00110f7c;
                  _numStreams = local_480;
                  local_448 = local_480 + (long)local_498;
                  local_460 = tempBuf[0];
                  local_440 = tempBuf[0] + _coderUsed;
                  local_438 = (_func_void_ptr_void_ptr_size_t *)(tempBuf[1] + lStack_4b0);
                  local_458._8_8_ = pbVar33;
                  local_458._0_8_ = tempBuf[1];
                  local_430 = (_func_void_ptr_void_ptr_size_t *)(pbVar33 + inSize);
                  local_428 = outBuffer;
                  local_420 = local_160;
                  local_414 = 0;
                  local_40d = (code)0x0;
                  uStack_40c = 0;
                  uStack_408 = 0;
                  for (lVar37 = 0x32; lVar37 != 0x134; lVar37 = lVar37 + 1) {
                    *(undefined2 *)((long)&numStreams + lVar37 * 2) = 0x400;
                  }
                  local_418 = 9;
                  UVar20 = 0;
                  while( true ) {
                    if ((int)UVar20 == 1) {
                      if (uStack_408 != 0) goto LAB_00110f7c;
                    }
                    else if ((int)UVar20 == 5) {
                      if (uStack_408 == 0xffffffff) goto LAB_00110f7c;
                      uStack_40c = 0xffffffff;
                      goto LAB_001107d0;
                    }
                    if (inSize == UVar20) break;
                    local_458._8_8_ = pbVar33 + 1;
                    uStack_408 = uStack_408 << 8 | (uint)*pbVar33;
                    UVar20 = UVar20 + 1;
                    uStack_40c = (uint)UVar20;
                    pbVar33 = pbVar33 + 1;
                  }
                  bVar45 = false;
                  goto LAB_00110f3c;
                }
              }
              goto LAB_00110f80;
            }
LAB_0010f9f3:
            uVar10 = 0;
            if ((int)local_518 == 4) {
              p_Var38 = (_func_void_ptr_void_ptr_size_t *)local_148[local_508];
              uVar10 = *(uint *)(&DAT_0011bb34 + local_508 * 4);
              local_520 = p_Var38;
              if (local_508 < 2) {
                p_Var19 = (_func_void_void_ptr_void_ptr *)
                          (*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,(size_t)p_Var38);
                if (p_Var38 != (_func_void_ptr_void_ptr_size_t *)0x0 &&
                    p_Var19 == (_func_void_void_ptr_void_ptr *)0x0) goto LAB_0011102f;
                uVar44 = (ulong)(uint)((1 - (int)local_508) * 8);
                *(_func_void_void_ptr_void_ptr **)((long)tempBuf + uVar44) = p_Var19;
                *(_func_void_ptr_void_ptr_size_t **)(coderUsed + uVar44) = local_520;
              }
              else {
                if (local_508 != 2) goto LAB_00111028;
                if (local_510 < p_Var38) {
                  uVar15 = 5;
                  goto LAB_00110f80;
                }
                local_480 = (_func_void_void_ptr_void_ptr *)
                            (outBuffer + ((long)local_510 - (long)p_Var38));
                p_Var19 = local_480;
                local_498 = p_Var38;
              }
            }
            else {
              local_520 = local_510;
              p_Var19 = (_func_void_void_ptr_void_ptr *)outBuffer;
            }
            p_Var38 = (&pIVar18->Alloc)[uVar10];
            p_Var40 = (&pIVar18->Alloc)[uVar10 + 1];
            _numStreams = (_func_void_void_ptr_void_ptr *)(p_Var38 + startPos);
            alloc = pIVar18;
            uVar15 = (*local_500->Seek)(local_500,(Int64 *)&numStreams,SZ_SEEK_SET);
            p_Var43 = _numCoders;
            uVar39 = local_4e4;
            if (uVar15 == 0) {
              p_Var40 = p_Var40 + -(long)p_Var38;
              if (UVar17 == 0x30101) {
                local_458 = (undefined1  [16])0x0;
                uVar15 = LzmaDec_AllocateProbs
                                   ((CLzmaDec *)&numStreams,local_4c0 + pCVar1->PropsOffset,
                                    (uint)(&local_1a0)[uVar34].PropsSize,alloc);
                uVar39 = local_4e4;
                if (uVar15 == 0) {
                  local_458._8_8_ = p_Var19;
                  local_430 = local_520;
                  local_438 = (_func_void_ptr_void_ptr_size_t *)0x0;
                  uStack_40c = 0;
                  uStack_408 = 1;
                  local_3fc[0] = 0;
                  local_428 = (byte *)0x0;
                  local_404[0] = 1;
                  do {
                    _numCoders = (_func_void_ptr_void_ptr_size_t *)0x0;
                    inBuf = (_func_void_ptr_void_ptr_size_t *)0x40000;
                    if (p_Var40 < (_func_void_ptr_void_ptr_size_t *)0x40000) {
                      inBuf = p_Var40;
                    }
                    uVar15 = (*local_500->Look)(local_500,(void **)&numCoders,(size_t *)&inBuf);
                    p_Var38 = local_438;
                    if (uVar15 != 0) break;
                    inProcessed = (SizeT)inBuf;
                    uVar15 = LzmaDec_DecodeToDic((CLzmaDec *)&numStreams,(SizeT)local_520,
                                                 (Byte *)_numCoders,&inProcessed,LZMA_FINISH_END,
                                                 &local_524);
                    inBuf = (void *)((long)inBuf - inProcessed);
                    if (uVar15 != 0) break;
                    p_Var40 = p_Var40 + -inProcessed;
                    if (local_524 == LZMA_STATUS_FINISHED_WITH_MARK) {
                      bVar45 = local_438 == local_520 &&
                               p_Var40 == (_func_void_ptr_void_ptr_size_t *)0x0;
                      goto LAB_00110a35;
                    }
                    if (((local_524 == LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK) &&
                        (local_438 == local_520)) &&
                       (p_Var40 == (_func_void_ptr_void_ptr_size_t *)0x0)) {
                      uVar15 = 0;
                      break;
                    }
                    if ((inProcessed == 0) && (p_Var38 == local_438)) goto LAB_001107ac;
                    uVar15 = (*local_500->Skip)(local_500,inProcessed);
                  } while (uVar15 == 0);
LAB_00110a3e:
                  (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,(void *)local_458._0_8_);
joined_r0x0010fd6d:
                  uVar39 = local_4e4;
                  if (uVar15 == 0) goto LAB_00110a5c;
                }
              }
              else if (UVar17 == 0x21) {
                local_458 = (undefined1  [16])0x0;
                uVar15 = local_4e4;
                if ((&local_1a0)[uVar34].PropsSize == '\x01') {
                  bVar25 = local_4c0[pCVar1->PropsOffset];
                  if (bVar25 < 0x29) {
                    uVar10 = 0xffffffff;
                    if (bVar25 != 0x28) {
                      uVar10 = (bVar25 & 1 | 2) << ((bVar25 >> 1) + 0xb & 0x1f);
                    }
                    numCoders = CONCAT13((char)(uVar10 >> 0x10),
                                         CONCAT12((char)(uVar10 >> 8),CONCAT11((char)uVar10,4)));
                    uStack_133 = SUB83(p_Var43,5);
                    _numCoders = CONCAT14((char)(uVar10 >> 0x18),numCoders);
                    uVar15 = LzmaDec_AllocateProbs
                                       ((CLzmaDec *)&numStreams,(Byte *)&numCoders,5,
                                        (ISzAlloc *)(ulong)(uVar10 >> 0x10));
                    uVar39 = uVar15;
                    if (uVar15 == 0) {
                      local_458._8_8_ = p_Var19;
                      local_430 = local_520;
                      local_3d8 = 0;
                      local_3d0 = 1;
                      iStack_3cc = 1;
                      local_404[0] = 1;
                      local_438 = (_func_void_ptr_void_ptr_size_t *)0x0;
                      uStack_40c = 0;
                      uStack_408 = 1;
                      local_3fc[0] = 0;
                      local_428 = (byte *)0x0;
                      local_3c8 = local_404[0];
LAB_0010fe77:
                      inBuf = (void *)0x0;
                      inProcessed = (SizeT)(_func_void_ptr_void_ptr_size_t *)0x40000;
                      if (p_Var40 < (_func_void_ptr_void_ptr_size_t *)0x40000) {
                        inProcessed = (SizeT)p_Var40;
                      }
                      uVar15 = (*local_500->Look)(local_500,&inBuf,&inProcessed);
                      SVar8 = inProcessed;
                      if (uVar15 == 0) {
                        local_524 = LZMA_STATUS_NOT_SPECIFIED;
                        local_518 = (byte *)inBuf;
                        local_140 = local_438;
                        p_Var43 = (_func_void_ptr_void_ptr_size_t *)0x0;
                        p_Var38 = local_438;
LAB_0010fece:
                        do {
                          p_Var32 = p_Var38;
                          uVar10 = local_3e0;
                          if (local_3d8 == 8) {
                            local_524 = LZMA_STATUS_FINISHED_WITH_MARK;
                            uVar15 = 0;
                            goto LAB_001103b8;
                          }
                          uVar12 = local_3d8;
                          if (local_3d8 == 9) break;
                          if ((local_3d8 & 0xfffffffe) == 6) {
                            p_Var35 = local_520 + -(long)p_Var38;
                            _numCoders = (_func_void_ptr_void_ptr_size_t *)(SVar8 - (long)p_Var43);
                            p_Var27 = (_func_void_ptr_void_ptr_size_t *)(ulong)local_3dc;
                            p_Var36 = p_Var35;
                            if (p_Var27 <= p_Var35) {
                              p_Var36 = p_Var27;
                            }
                            if ((char)local_3d4 < '\0') {
                              if (local_3d8 == 6) {
                                bVar25 = local_3d4 >> 5 & 3;
                                if (bVar25 == 3) {
                                  local_3fc[0] = 0;
                                  local_428 = (byte *)((ulong)local_428 & 0xffffffff00000000);
                                  puVar24 = (uint *)((long)&local_428 + 4);
LAB_0011020d:
                                  uStack_408 = 1;
                                  uStack_40c = 0;
                                  *puVar24 = 0;
                                  local_404[0] = 1;
LAB_0011021b:
                                  local_3d0 = 0;
                                  iStack_3cc = 0;
                                  local_3d8 = 7;
                                  goto LAB_0011022f;
                                }
                                if (local_3d0 == 0) {
                                  if (bVar25 != 0) {
                                    puVar24 = local_3fc;
                                    goto LAB_0011020d;
                                  }
                                  if (iStack_3cc != 0) goto LAB_0011037c;
                                  uStack_40c = 0;
                                  uStack_408 = 1;
                                  local_3fc[0] = 0;
                                  goto LAB_0011021b;
                                }
LAB_0011037c:
                                local_3e0 = uVar10;
                                local_3d8 = 9;
                                uVar15 = 1;
                                p_Var32 = p_Var38;
                                uVar10 = local_3e0;
                                goto LAB_001103b8;
                              }
LAB_0011022f:
                              if ((_func_void_ptr_void_ptr_size_t *)(ulong)local_3e0 < _numCoders) {
                                _numCoders = (_func_void_ptr_void_ptr_size_t *)(ulong)local_3e0;
                              }
                              uVar15 = LzmaDec_DecodeToDic((CLzmaDec *)&numStreams,
                                                           (SizeT)(p_Var36 + (long)p_Var38),
                                                           local_518,(SizeT *)&numCoders,
                                                           (uint)(p_Var27 <= p_Var35),&local_524);
                              p_Var43 = p_Var43 + (long)_numCoders;
                              uVar10 = local_3e0 - (uint)_numCoders;
                              local_3dc = ((int)p_Var38 - (int)local_438) + local_3dc;
                              p_Var32 = local_438;
                              if (uVar15 != 0) goto LAB_001103b8;
                              if (local_524 == LZMA_STATUS_NEEDS_MORE_INPUT) {
                                uVar15 = 0;
                                goto LAB_001103b8;
                              }
                              local_518 = local_518 + (long)_numCoders;
                              if ((_numCoders == (_func_void_ptr_void_ptr_size_t *)0x0) &&
                                 (p_Var38 == local_438)) {
                                if (((local_524 != LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK) ||
                                    (local_3dc != 0)) || (local_3e0 != (uint)_numCoders))
                                goto LAB_0011037c;
                                local_3d8 = 0;
                              }
                              else {
                                p_Var38 = local_438;
                                local_3e0 = uVar10;
                                if (local_524 != LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK)
                                goto LAB_0010fece;
                              }
                              local_524 = LZMA_STATUS_NOT_FINISHED;
                              p_Var38 = local_438;
                              local_3e0 = uVar10;
                            }
                            else {
                              if ((_func_void_ptr_void_ptr_size_t *)SVar8 == p_Var43) {
                                local_524 = LZMA_STATUS_NEEDS_MORE_INPUT;
                                uVar15 = 0;
                                p_Var43 = (_func_void_ptr_void_ptr_size_t *)SVar8;
                                goto LAB_001103b8;
                              }
                              if (local_3d8 == 6) {
                                if (local_3d4 == 1) {
                                  iStack_3cc = 1;
                                  local_3c8 = 1;
                                }
                                else if (local_3d0 != 0) goto LAB_0011037c;
                                local_3d0 = 0;
                                local_3fc[0] = 0;
                                uStack_40c = 0;
                                uStack_408 = 1;
                                if (local_3d4 == 1) {
                                  local_428 = (byte *)0x0;
                                  local_404[0] = 1;
                                }
                              }
                              p_Var32 = _numCoders;
                              if (p_Var36 < _numCoders) {
                                p_Var32 = p_Var36;
                              }
                              _numCoders = p_Var32;
                              if (p_Var32 == (_func_void_ptr_void_ptr_size_t *)0x0)
                              goto LAB_0011037c;
                              memcpy(p_Var38 + local_458._8_8_,local_518,(size_t)p_Var32);
                              p_Var38 = local_438 + (long)p_Var32;
                              UVar17 = (UInt32)local_428;
                              if ((local_428._4_4_ == 0) &&
                                 ((_func_void_ptr_void_ptr_size_t *)
                                  (ulong)(local_460._4_4_ - (UInt32)local_428) <= p_Var32)) {
                                local_428 = (byte *)((ulong)local_460._4_4_ << 0x20);
                              }
                              local_428 = (byte *)CONCAT44(local_428._4_4_,UVar17 + (int)p_Var32);
                              local_518 = local_518 + (long)p_Var32;
                              p_Var43 = p_Var43 + (long)p_Var32;
                              local_3dc = local_3dc - (int)p_Var32;
                              local_3d8 = 7;
                              local_438 = p_Var38;
                              if (local_3dc == 0) {
                                local_3d8 = 0;
                              }
                            }
                            goto LAB_0010fece;
                          }
                          if ((_func_void_ptr_void_ptr_size_t *)SVar8 == p_Var43) {
                            local_524 = LZMA_STATUS_NEEDS_MORE_INPUT;
                            uVar15 = 0;
                            p_Var43 = (_func_void_ptr_void_ptr_size_t *)SVar8;
                            goto LAB_001103b8;
                          }
                          uVar12 = 9;
                          uVar10 = uVar12;
                          if (local_3d8 < 6) {
                            bVar25 = *local_518;
                            uVar15 = (uint)bVar25;
                            switch(local_3d8) {
                            case 0:
                              uVar10 = 8;
                              local_3d4 = bVar25;
                              if (bVar25 != 0) {
                                if ((char)bVar25 < '\0') {
                                  local_3dc = (uVar15 & 0x1f) << 0x10;
                                }
                                else {
                                  uVar10 = uVar12;
                                  if (2 < bVar25) break;
                                  local_3dc = 0;
                                }
                                uVar10 = 1;
                              }
                              break;
                            case 1:
                              local_3dc = local_3dc | uVar15 << 8;
                              uVar10 = 2;
                              break;
                            case 2:
                              local_3dc = (uVar15 | local_3dc) + 1;
                              uVar10 = (uint)(-1 < (char)local_3d4) * 3 + 3;
                              break;
                            case 3:
                              local_3e0 = uVar15 << 8;
                              uVar10 = 4;
                              break;
                            case 4:
                              local_3e0 = (uVar15 | local_3e0) + 1;
                              uVar10 = 5;
                              if ((local_3d4 & 0x40) == 0) {
                                uVar10 = (uint)(local_3c8 != 0) * 3 + 6;
                              }
                              break;
                            case 5:
                              if (bVar25 < 0xe1) {
                                local_460 = (Byte *)CONCAT44(local_460._4_4_,(uint)(bVar25 / 0x2d));
                                cVar22 = (char)((ushort)(bVar25 / 9) % 5);
                                if ((byte)(cVar22 + bVar25 % 9) < 5) {
                                  _numStreams = (_func_void_void_ptr_void_ptr *)
                                                (ulong)CONCAT14(cVar22,(uint)(bVar25 % 9));
                                  local_3c8 = 0;
                                  uVar10 = 6;
                                }
                              }
                            }
                          }
                          p_Var43 = p_Var43 + 1;
                          local_518 = local_518 + 1;
                          p_Var32 = local_520;
                          local_3d8 = uVar10;
                        } while (uVar10 == 8 || local_520 != p_Var38);
                        local_3d8 = uVar12;
                        uVar15 = 1;
                        uVar10 = local_3e0;
LAB_001103b8:
                        local_3e0 = uVar10;
                        inProcessed = inProcessed - (long)p_Var43;
                        if (uVar15 == 0) {
                          p_Var40 = p_Var40 + -(long)p_Var43;
                          if (local_524 == LZMA_STATUS_FINISHED_WITH_MARK) {
                            bVar45 = p_Var32 == local_520 &&
                                     p_Var40 == (_func_void_ptr_void_ptr_size_t *)0x0;
LAB_00110a35:
                            uVar15 = (uint)!bVar45;
                          }
                          else {
                            if ((p_Var43 != (_func_void_ptr_void_ptr_size_t *)0x0) ||
                               (local_140 != p_Var32)) goto LAB_001103e7;
LAB_001107ac:
                            uVar15 = 1;
                          }
                        }
                      }
                      goto LAB_00110a3e;
                    }
                  }
                  else {
                    uVar15 = 4;
                    uVar39 = uVar15;
                  }
                }
              }
              else {
                if (UVar17 == 0) {
                  if (p_Var40 == local_520) {
                    uVar15 = SzDecodeCopy((UInt64)local_520,local_500,(Byte *)p_Var19);
                    goto joined_r0x0010fd6d;
                  }
                  goto LAB_00110f7c;
                }
LAB_00111028:
                uVar15 = 4;
                uVar39 = local_4e4;
              }
            }
            goto LAB_00110f80;
          }
          uVar15 = 0;
        }
      }
LAB_00110f80:
      local_4e4 = uVar39;
      for (lVar37 = 0; lVar37 != 3; lVar37 = lVar37 + 1) {
        (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,tempBuf[lVar37]);
      }
      if (uVar15 != 0) {
        return uVar15;
      }
      pBVar29 = (local_4c8->FolderCRCs).Defs;
      if (pBVar29 == (Byte *)0x0) {
        return 0;
      }
      if ((char)(pBVar29[folderIndex >> 3] << ((byte)folderIndex & 7)) < '\0') {
        UVar17 = (*g_CrcUpdate)(0xffffffff,outBuffer,(size_t)local_510,g_CrcTable);
        return (uint)((UVar17 ^ (local_4c8->FolderCRCs).Vals[folderIndex]) != 0xffffffff) * 3;
      }
      return 0;
    }
    for (uVar34 = 0; (uint)aBVar30 != uVar34; uVar34 = uVar34 + 1) {
      if (*(char *)((long)&numStreams + uVar34) == '\0') {
        local_1c8 = SUB84(uVar34,0);
        if (aBVar30 == local_1c8) {
          return 0x10;
        }
        goto LAB_0010f683;
      }
    }
  }
  return 0x10;
LAB_001103e7:
  uVar15 = (*local_500->Skip)(local_500,(size_t)p_Var43);
  if (uVar15 != 0) goto LAB_00110a3e;
  goto LAB_0010fe77;
LAB_001107d0:
  local_418 = 9;
  if (uStack_40c < 0x1000000) {
    uVar9 = local_458._8_8_;
    if ((_func_void_ptr_void_ptr_size_t *)local_458._8_8_ == local_430) goto LAB_00110f36;
    uStack_40c = uStack_40c << 8;
    local_458._8_8_ = (code *)(local_458._8_8_ + 1);
    uStack_408 = (uint)*(byte *)uVar9 | uStack_408 << 8;
  }
  uVar34 = (long)local_448 - (long)_numStreams;
  if (uVar34 == 0) {
    bVar45 = true;
    goto LAB_00110f3c;
  }
  uVar44 = (long)local_160 - (long)local_428;
  if ((uVar44 < uVar34) && (uVar34 = uVar44, uVar44 == 0)) goto LAB_00110f36;
  p_Var28 = _numStreams + uVar34;
  pbVar33 = local_428;
  p_Var19 = _numStreams;
LAB_00110882:
  while( true ) {
    bVar25 = (byte)*p_Var19;
    *pbVar33 = bVar25;
    if (bVar25 != 0xf) break;
    p_Var19 = p_Var19 + 1;
    if (p_Var19 == p_Var28) goto LAB_00110a72;
    pbVar33 = pbVar33 + 1;
  }
  if ((bVar25 & 0xfe) != 0xe8) goto code_r0x00110893;
  lVar37 = (long)p_Var19 - (long)_numStreams;
  if (p_Var19 == p_Var28) {
LAB_00110a7d:
    local_40d = p_Var28[-1];
    _numStreams = p_Var28;
    local_414 = local_414 + (int)lVar37;
    local_428 = local_428 + lVar37;
    bVar45 = p_Var28 == local_448;
    goto LAB_00110f3c;
  }
  local_40d = *p_Var19;
  pcVar21 = p_Var19 + -1;
  if (p_Var19 == _numStreams) {
    pcVar21 = (code *)(local_410 + 3);
  }
  _numStreams = p_Var19 + 1;
  local_414 = local_414 + (int)(lVar37 + 1);
  local_428 = local_428 + lVar37 + 1;
  uVar34 = (ulong)(local_40d == (code)0xe9);
  if (local_40d == (code)0xe8) {
    uVar34 = (ulong)(byte)*pcVar21 + 2;
  }
  uVar3 = *(ushort *)((long)local_404 + uVar34 * 2);
  uVar12 = (uStack_40c >> 0xb) * (uint)uVar3;
  uVar10 = uStack_408 - uVar12;
  if (uStack_408 < uVar12) {
    uStack_40c = uVar12;
    *(ushort *)((long)local_404 + uVar34 * 2) = (short)(0x800 - uVar3 >> 5) + uVar3;
    goto LAB_001107d0;
  }
  uStack_40c = uStack_40c - uVar12;
  uStack_408 = uVar10;
  *(ushort *)((long)local_404 + uVar34 * 2) = uVar3 - (uVar3 >> 5);
  local_418 = (local_40d != (code)0xe8) + 1;
  uVar34 = (ulong)local_418;
  p_Var19 = *(_func_void_void_ptr_void_ptr **)(&numStreams + uVar34 * 2);
  if (p_Var19 == (&local_448)[uVar34]) goto LAB_00110ee2;
  uVar12 = *(uint *)p_Var19;
  *(_func_void_void_ptr_void_ptr **)(&numStreams + uVar34 * 2) = p_Var19 + 4;
  local_414 = local_414 + 4;
  iVar16 = (uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18) -
           local_414;
  uVar34 = (long)local_160 - (long)local_428;
  bVar23 = (byte)((uint)iVar16 >> 8);
  bVar25 = (byte)((uint)iVar16 >> 0x10);
  local_40d = SUB41((uint)iVar16 >> 0x18,0);
  if (3 < uVar34) {
    *local_428 = (byte)iVar16;
    local_428[1] = bVar23;
    local_428[2] = bVar25;
    local_428[3] = (byte)local_40d;
    local_428 = local_428 + 4;
    goto LAB_001107d0;
  }
  local_410[0] = (byte)iVar16;
  local_410[1] = bVar23;
  local_410[2] = bVar25;
  for (uVar44 = 0; uVar34 != uVar44; uVar44 = uVar44 + 1) {
    local_428[uVar44] = local_410[uVar44];
  }
  local_428 = local_428 + uVar34;
  local_418 = (uint)uVar34 | 4;
LAB_00110ee2:
  if ((uStack_40c < 0x1000000) &&
     (uVar9 = local_458._8_8_, (_func_void_ptr_void_ptr_size_t *)local_458._8_8_ != local_430)) {
    uStack_40c = uStack_40c * 0x100;
    local_458._8_8_ = (code *)(local_458._8_8_ + 1);
    uStack_408 = (uint)*(byte *)uVar9 | uVar10 * 0x100;
  }
LAB_00110f36:
  bVar45 = false;
LAB_00110f3c:
  lVar37 = 0;
  while (lVar37 != 4) {
    lVar7 = lVar37 * 2;
    pp_Var2 = &local_448 + lVar37;
    lVar37 = lVar37 + 1;
    if (*(_func_void_void_ptr_void_ptr **)(&numStreams + lVar7) != *pp_Var2) goto LAB_00110f7c;
  }
  if ((uStack_408 != 0) || (!(bool)(local_428 == local_160 & bVar45))) {
LAB_00110f7c:
    uVar15 = 1;
    uVar39 = local_4e4;
    goto LAB_00110f80;
  }
LAB_00110a5c:
  local_508 = local_508 + 1;
  local_518 = (byte *)(ulong)uVar13;
  goto LAB_0010f9aa;
code_r0x00110893:
  p_Var19 = p_Var19 + 1;
  pbVar33 = pbVar33 + 1;
  if (p_Var19 == p_Var28) {
LAB_00110a72:
    lVar37 = (long)p_Var28 - (long)_numStreams;
    goto LAB_00110a7d;
  }
  goto LAB_00110882;
}

Assistant:

static SRes SzAr_DecodeFolder(const CSzAr *p, UInt32 folderIndex,
    ILookInStream *inStream, UInt64 startPos,
    Byte *outBuffer, size_t outSize,
    ISzAlloc *allocMain)
{
  SRes res;
  CSzFolder folder;
  CSzData sd;
  
  const Byte *data = p->CodersData + p->FoCodersOffsets[folderIndex];
  sd.Data = data;
  sd.Size = p->FoCodersOffsets[folderIndex + 1] - p->FoCodersOffsets[folderIndex];
  
  res = SzGetNextFolderItem(&folder, &sd);
  
  if (res != SZ_OK)
    return res;

  if (sd.Size != 0
      || folder.UnpackStream != p->FoToMainUnpackSizeIndex[folderIndex]
      || outSize != SzAr_GetFolderUnpackSize(p, folderIndex))
    return SZ_ERROR_FAIL;
  {
    unsigned i;
    Byte *tempBuf[3] = { 0, 0, 0};

    res = SzFolder_Decode2(&folder, data,
        &p->CoderUnpackSizes[p->FoToCoderUnpackSizes[folderIndex]],
        p->PackPositions + p->FoStartPackStreamIndex[folderIndex],
        inStream, startPos,
        outBuffer, (SizeT)outSize, allocMain, tempBuf);
    
    for (i = 0; i < 3; i++)
      IAlloc_Free(allocMain, tempBuf[i]);

    if (res == SZ_OK)
      if (SzBitWithVals_Check(&p->FolderCRCs, folderIndex))
        if (CrcCalc(outBuffer, outSize) != p->FolderCRCs.Vals[folderIndex])
          res = SZ_ERROR_CRC;

    return res;
  }
}